

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

bool sensors_analytics::Sdk::AssertKey(string *type,string *key)

{
  char cVar1;
  byte bVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  char *pcVar5;
  
  if (key->_M_string_length - 0x65 < 0xffffffffffffff9c) {
    pcVar5 = " is empty or too long, max length is 100";
  }
  else {
    pcVar5 = (key->_M_dataplus)._M_p;
    cVar1 = *pcVar5;
    if ((cVar1 == '$' || (byte)(cVar1 + 0x9fU) < 0x1a) ||
       (cVar1 == '_' || (byte)(cVar1 + 0xbfU) < 0x1a)) {
      uVar4 = 1;
      while( true ) {
        if (key->_M_string_length <= uVar4) {
          return true;
        }
        bVar2 = pcVar5[uVar4];
        if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf) && 9 < (byte)(bVar2 - 0x30)) && (bVar2 != 0x5f))
           && (bVar2 != 0x24)) break;
        uVar4 = uVar4 + 1;
      }
    }
    pcVar5 = " need to be a valid variable name.";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"The ");
  poVar3 = std::operator<<(poVar3,(string *)type);
  std::operator<<(poVar3,pcVar5);
  return false;
}

Assistant:

bool Sdk::AssertKey(const string &type, const string &key) {
  size_t len = key.length();
  if (len < 1 || len > 100) {
    std::cerr << "The " << type << " is empty or too long, max length is 100";
    return false;
  }
  char ch = key[0];
  if ((ch >= 'a' && ch <= 'z') || ch == '$' ||
      (ch >= 'A' && ch <= 'Z') || ch == '_') {
    for (size_t i = 1; i < len; ++i) {
      ch = key[i];
      if ((ch >= 'a' && ch <= 'z') || (ch >= '0' && ch <= '9') ||
          (ch >= 'A' && ch <= 'Z') || ch == '$' || ch == '_') {
        continue;
      }
      std::cerr << "The " << type << " need to be a valid variable name.";
      return false;
    }
    return true;
  } else {
    std::cerr << "The " << type << " need to be a valid variable name.";
    return false;
  }
}